

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::NegativeVertexAttribFormat::Run(NegativeVertexAttribFormat *this)

{
  GLenum GVar1;
  int local_20;
  GLenum local_1c;
  GLint p;
  GLenum glError;
  NegativeVertexAttribFormat *this_local;
  
  _p = this;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,1000,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8869,&local_20);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_20 + 1,4,0x1406,'\0',0);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glVertexAttribIFormat
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_20 + 2,4,0x1404,0);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glVertexAttribLFormat
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_20 + 3,4,0x140a,0);
      GVar1 = glu::CallLogWrapper::glGetError
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar1 == 0x501) {
        glu::CallLogWrapper::glVertexAttribFormat
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,0x1406,'\0',0);
        GVar1 = glu::CallLogWrapper::glGetError
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper);
        if (GVar1 == 0x501) {
          glu::CallLogWrapper::glVertexAttribFormat
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,5,0x1406,'\0',0);
          GVar1 = glu::CallLogWrapper::glGetError
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper);
          if (GVar1 == 0x501) {
            glu::CallLogWrapper::glVertexAttribIFormat
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0,5,0x1404,0);
            GVar1 = glu::CallLogWrapper::glGetError
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper);
            if (GVar1 == 0x501) {
              glu::CallLogWrapper::glVertexAttribLFormat
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0,0,0x140a,0);
              GVar1 = glu::CallLogWrapper::glGetError
                                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper);
              if (GVar1 == 0x501) {
                glu::CallLogWrapper::glVertexAttribIFormat
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0,0x80e1,0x1404,0);
                local_1c = glu::CallLogWrapper::glGetError
                                     (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                       super_GLWrapper.super_CallLogWrapper);
                if ((local_1c == 0x502) || (local_1c == 0x501)) {
                  glu::CallLogWrapper::glVertexAttribLFormat
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0,0x80e1,0x140a,0);
                  local_1c = glu::CallLogWrapper::glGetError
                                       (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                         super_GLWrapper.super_CallLogWrapper);
                  if ((local_1c == 0x502) || (local_1c == 0x501)) {
                    glu::CallLogWrapper::glVertexAttribFormat
                              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,0,4,0x822e,'\0',0);
                    GVar1 = glu::CallLogWrapper::glGetError
                                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                        super_GLWrapper.super_CallLogWrapper);
                    if (GVar1 == 0x500) {
                      glu::CallLogWrapper::glVertexAttribIFormat
                                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0,4,0x1406,0);
                      GVar1 = glu::CallLogWrapper::glGetError
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper);
                      if (GVar1 == 0x500) {
                        glu::CallLogWrapper::glVertexAttribLFormat
                                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                    super_GLWrapper.super_CallLogWrapper,0,4,0x1404,0);
                        GVar1 = glu::CallLogWrapper::glGetError
                                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                            super_GLWrapper.super_CallLogWrapper);
                        if (GVar1 == 0x500) {
                          glu::CallLogWrapper::glVertexAttribFormat
                                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                      super_GLWrapper.super_CallLogWrapper,0,0x80e1,0x1406,'\x01',0)
                          ;
                          GVar1 = glu::CallLogWrapper::glGetError
                                            (&(this->super_VertexAttribBindingBase).
                                              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
                                            );
                          if (GVar1 == 0x502) {
                            glu::CallLogWrapper::glVertexAttribFormat
                                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                        super_GLWrapper.super_CallLogWrapper,0,3,0x8d9f,'\0',0);
                            GVar1 = glu::CallLogWrapper::glGetError
                                              (&(this->super_VertexAttribBindingBase).
                                                super_SubcaseBase.super_GLWrapper.
                                                super_CallLogWrapper);
                            if (GVar1 == 0x502) {
                              glu::CallLogWrapper::glVertexAttribFormat
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper,0,0x80e1,0x1401,'\0',
                                         0);
                              GVar1 = glu::CallLogWrapper::glGetError
                                                (&(this->super_VertexAttribBindingBase).
                                                  super_SubcaseBase.super_GLWrapper.
                                                  super_CallLogWrapper);
                              if (GVar1 == 0x502) {
                                glu::CallLogWrapper::glGetIntegerv
                                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                            super_GLWrapper.super_CallLogWrapper,0x82d9,&local_20);
                                glu::CallLogWrapper::glVertexAttribFormat
                                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                            super_GLWrapper.super_CallLogWrapper,0,4,0x1406,'\0',
                                           local_20 + 10);
                                GVar1 = glu::CallLogWrapper::glGetError
                                                  (&(this->super_VertexAttribBindingBase).
                                                    super_SubcaseBase.super_GLWrapper.
                                                    super_CallLogWrapper);
                                if (GVar1 == 0x501) {
                                  glu::CallLogWrapper::glVertexAttribIFormat
                                            (&(this->super_VertexAttribBindingBase).
                                              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
                                             ,0,4,0x1404,local_20 + 10);
                                  GVar1 = glu::CallLogWrapper::glGetError
                                                    (&(this->super_VertexAttribBindingBase).
                                                      super_SubcaseBase.super_GLWrapper.
                                                      super_CallLogWrapper);
                                  if (GVar1 == 0x501) {
                                    glu::CallLogWrapper::glVertexAttribLFormat
                                              (&(this->super_VertexAttribBindingBase).
                                                super_SubcaseBase.super_GLWrapper.
                                                super_CallLogWrapper,0,4,0x140a,local_20 + 10);
                                    GVar1 = glu::CallLogWrapper::glGetError
                                                      (&(this->super_VertexAttribBindingBase).
                                                        super_SubcaseBase.super_GLWrapper.
                                                        super_CallLogWrapper);
                                    if (GVar1 == 0x501) {
                                      glu::CallLogWrapper::glBindVertexArray
                                                (&(this->super_VertexAttribBindingBase).
                                                  super_SubcaseBase.super_GLWrapper.
                                                  super_CallLogWrapper,0);
                                      glu::CallLogWrapper::glVertexAttribFormat
                                                (&(this->super_VertexAttribBindingBase).
                                                  super_SubcaseBase.super_GLWrapper.
                                                  super_CallLogWrapper,0,4,0x1406,'\0',0);
                                      GVar1 = glu::CallLogWrapper::glGetError
                                                        (&(this->super_VertexAttribBindingBase).
                                                          super_SubcaseBase.super_GLWrapper.
                                                          super_CallLogWrapper);
                                      if (GVar1 == 0x502) {
                                        glu::CallLogWrapper::glVertexAttribIFormat
                                                  (&(this->super_VertexAttribBindingBase).
                                                    super_SubcaseBase.super_GLWrapper.
                                                    super_CallLogWrapper,0,4,0x1404,0);
                                        GVar1 = glu::CallLogWrapper::glGetError
                                                          (&(this->super_VertexAttribBindingBase).
                                                            super_SubcaseBase.super_GLWrapper.
                                                            super_CallLogWrapper);
                                        if (GVar1 == 0x502) {
                                          glu::CallLogWrapper::glVertexAttribLFormat
                                                    (&(this->super_VertexAttribBindingBase).
                                                      super_SubcaseBase.super_GLWrapper.
                                                      super_CallLogWrapper,0,4,0x140a,0);
                                          GVar1 = glu::CallLogWrapper::glGetError
                                                            (&(this->super_VertexAttribBindingBase).
                                                              super_SubcaseBase.super_GLWrapper.
                                                              super_CallLogWrapper);
                                          if (GVar1 == 0x502) {
                                            this_local = (NegativeVertexAttribFormat *)0x0;
                                          }
                                          else {
                                            anon_unknown_0::Output
                                                      ("INVALID_OPERATION should be generated.\n");
                                            this_local = (NegativeVertexAttribFormat *)
                                                         &DAT_ffffffffffffffff;
                                          }
                                        }
                                        else {
                                          anon_unknown_0::Output
                                                    ("INVALID_OPERATION should be generated.\n");
                                          this_local = (NegativeVertexAttribFormat *)
                                                       &DAT_ffffffffffffffff;
                                        }
                                      }
                                      else {
                                        anon_unknown_0::Output
                                                  ("INVALID_OPERATION should be generated.\n");
                                        this_local = (NegativeVertexAttribFormat *)
                                                     &DAT_ffffffffffffffff;
                                      }
                                    }
                                    else {
                                      anon_unknown_0::Output("INVALID_VALUE should be generated.\n")
                                      ;
                                      this_local = (NegativeVertexAttribFormat *)
                                                   &DAT_ffffffffffffffff;
                                    }
                                  }
                                  else {
                                    anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
                                    this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff
                                    ;
                                  }
                                }
                                else {
                                  anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
                                  this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                                }
                              }
                              else {
                                anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
                                this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                              }
                            }
                            else {
                              anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
                              this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
                            this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          anon_unknown_0::Output("INVALID_ENUM should be generated.\n");
                          this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        anon_unknown_0::Output("INVALID_ENUM should be generated.\n");
                        this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      anon_unknown_0::Output("INVALID_ENUM should be generated.\n");
                      this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
                    this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
                  this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
                }
              }
              else {
                anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
                this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
              }
            }
            else {
              anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
              this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
            }
          }
          else {
            anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
            this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
          this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
        this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
      this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
    this_local = (NegativeVertexAttribFormat *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLenum glError;

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexAttribFormat(p + 1, 4, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(p + 2, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(p + 3, 4, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}

		glVertexAttribFormat(0, 0, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 5, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 5, GL_INT, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 0, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, GL_BGRA, GL_INT, 0);
		glError = glGetError();
		if (glError != GL_INVALID_OPERATION && glError != GL_INVALID_VALUE)
		{
			//two possible errors here: INVALID_VALUE because GL_BGRA used in *IFormat
			//function AND INVALID_OPERATION because GL_BGRA used with GL_INT
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, GL_BGRA, GL_DOUBLE, 0);
		glError = glGetError();
		if (glError != GL_INVALID_OPERATION && glError != GL_INVALID_VALUE)
		{
			//two possible errors here: INVALID_VALUE because GL_BGRA used in *IFormat
			//function AND INVALID_OPERATION because GL_BGRA used with GL_DOUBLE
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 4, GL_R32F, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_FLOAT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			Output("INVALID_ENUM should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, GL_BGRA, GL_FLOAT, GL_TRUE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, 3, GL_INT_2_10_10_10_REV, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribFormat(0, GL_BGRA, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_INT, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_DOUBLE, p + 10);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribIFormat(0, 4, GL_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		glVertexAttribLFormat(0, 4, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		return NO_ERROR;
	}